

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void btDbvt::rayTest(btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,ICollide *policy)

{
  btDbvtNode *pbVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int i;
  btDbvtNode **ppbVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btVector3 bounds [2];
  btAlignedObjectArray<const_btDbvtNode_*> bStack_e8;
  btDbvtNode **local_c8;
  float *local_c0;
  float local_b4;
  long local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ICollide *local_60;
  float *local_58;
  float *local_50;
  undefined1 local_48 [16];
  
  if (root != (btDbvtNode *)0x0) {
    local_c0 = (float *)CONCAT44(local_c0._4_4_,rayTo->m_floats[2] - rayFrom->m_floats[2]);
    local_a8 = *(undefined8 *)rayTo->m_floats;
    uStack_a0 = 0;
    local_98 = *(float **)rayFrom->m_floats;
    uStack_90 = 0;
    bStack_e8.m_ownsMemory = true;
    bStack_e8.m_data = (btDbvtNode **)0x0;
    bStack_e8.m_size = 0;
    bStack_e8.m_capacity = 0;
    local_60 = policy;
    ppbVar5 = (btDbvtNode **)btAlignedAllocInternal(0x400,0x10);
    if (0 < (long)bStack_e8.m_size) {
      lVar7 = 0;
      do {
        ppbVar5[lVar7] = bStack_e8.m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (bStack_e8.m_size != lVar7);
    }
    if ((bStack_e8.m_data != (btDbvtNode **)0x0) && (bStack_e8.m_ownsMemory == true)) {
      btAlignedFreeInternal(bStack_e8.m_data);
    }
    local_98._0_4_ = (float)local_a8 - (float)local_98;
    local_98._4_4_ = local_a8._4_4_ - local_98._4_4_;
    fVar12 = 1.0 / SQRT(local_c0._0_4_ * local_c0._0_4_ +
                        (float)local_98 * (float)local_98 + local_98._4_4_ * local_98._4_4_);
    fVar18 = local_c0._0_4_ * fVar12;
    fVar13 = fVar12 * (float)local_98;
    fVar14 = fVar12 * local_98._4_4_;
    fVar15 = fVar12 * ((float)uStack_a0 - (float)uStack_90);
    fVar12 = fVar12 * (uStack_a0._4_4_ - uStack_90._4_4_);
    auVar16._4_4_ = fVar14;
    auVar16._0_4_ = fVar13;
    auVar16._8_4_ = fVar15;
    auVar16._12_4_ = fVar12;
    auVar16 = divps(_DAT_001ee3f0,auVar16);
    local_a8._0_4_ =
         (float)(-(uint)(fVar13 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar13 == 0.0) & auVar16._0_4_);
    local_a8._4_4_ =
         (float)(-(uint)(fVar14 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar14 == 0.0) & auVar16._4_4_);
    fVar17 = (float)(-(uint)(fVar18 == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(fVar18 == 0.0) & (uint)(1.0 / fVar18));
    local_48 = ZEXT416((uint)fVar17);
    uStack_a0 = CONCAT44(~-(uint)(fVar12 == 0.0) & auVar16._12_4_,
                         ~-(uint)(fVar15 == 0.0) & auVar16._8_4_);
    local_b4 = fVar18 * local_c0._0_4_ + fVar13 * (float)local_98 + local_98._4_4_ * fVar14;
    bStack_e8.m_ownsMemory = true;
    lVar7 = 0;
    do {
      ppbVar5[lVar7] = (btDbvtNode *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    bVar3 = 0.0 <= local_a8._4_4_;
    bVar4 = (float)local_a8 < 0.0;
    bStack_e8.m_capacity = 0x80;
    bStack_e8.m_size = 0x80;
    *ppbVar5 = root;
    local_c0 = (float *)(&local_88 + (ulong)(0.0 <= (float)local_a8) * 2);
    local_98 = (float *)((long)&local_88 + (ulong)(local_a8._4_4_ < 0.0) * 0x10 + 4);
    local_58 = (float *)(&uStack_80 + (ulong)(fVar17 < 0.0) * 2);
    local_50 = (float *)(&uStack_80 + (ulong)(0.0 <= fVar17) * 2);
    iVar9 = 1;
    iVar8 = 0x7e;
    bStack_e8.m_data = ppbVar5;
    do {
      iVar10 = iVar9 + -1;
      pbVar1 = bStack_e8.m_data[(long)iVar9 + -1];
      local_88 = *(undefined8 *)(pbVar1->volume).mi.m_floats;
      uStack_80 = *(undefined8 *)((pbVar1->volume).mi.m_floats + 2);
      local_78 = *(undefined8 *)(pbVar1->volume).mx.m_floats;
      uStack_70 = *(undefined8 *)((pbVar1->volume).mx.m_floats + 2);
      fVar12 = (float)*(undefined8 *)rayFrom->m_floats;
      fVar13 = (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
      fVar14 = (*(float *)(&local_88 + (ulong)bVar4 * 2) - fVar12) * (float)local_a8;
      fVar17 = (*(float *)((long)&local_88 + (ulong)bVar3 * 0x10 + 4) - fVar13) * local_a8._4_4_;
      if (fVar14 <= fVar17) {
        fVar15 = (*local_c0 - fVar12) * (float)local_a8;
        fVar12 = (*local_98 - fVar13) * local_a8._4_4_;
        if (fVar12 <= fVar15) {
          auVar2._4_4_ = -(uint)(fVar14 < fVar12);
          auVar2._0_4_ = -(uint)(fVar14 < fVar12);
          auVar2._8_4_ = -(uint)(fVar17 < fVar15);
          auVar2._12_4_ = -(uint)(fVar17 < fVar15);
          uVar6 = movmskpd((int)local_c0,auVar2);
          if ((uVar6 & 1) == 0) {
            fVar12 = fVar14;
          }
          if ((uVar6 & 2) == 0) {
            fVar17 = fVar15;
          }
          fVar13 = (*local_50 - rayFrom->m_floats[2]) * (float)local_48._0_4_;
          if ((fVar12 <= fVar13) &&
             (fVar14 = (*local_58 - rayFrom->m_floats[2]) * (float)local_48._0_4_, fVar14 <= fVar17)
             ) {
            if (fVar14 <= fVar12) {
              fVar14 = fVar12;
            }
            if (fVar14 < local_b4) {
              if (fVar17 <= fVar13) {
                fVar13 = fVar17;
              }
              if (0.0 < fVar13) {
                if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
                  (*local_60->_vptr_ICollide[3])(local_60,pbVar1);
                }
                else {
                  if (iVar8 < iVar10) {
                    lVar11 = (long)bStack_e8.m_size;
                    lVar7 = lVar11 * 2;
                    if (bStack_e8.m_size < (int)lVar7) {
                      if (bStack_e8.m_capacity < (int)lVar7) {
                        local_b0 = lVar7;
                        if (bStack_e8.m_size == 0) {
                          local_c8 = (btDbvtNode **)0x0;
                        }
                        else {
                          local_c8 = (btDbvtNode **)btAlignedAllocInternal(lVar11 << 4,0x10);
                          if (0 < (long)bStack_e8.m_size) {
                            lVar7 = 0;
                            do {
                              local_c8[lVar7] = bStack_e8.m_data[lVar7];
                              lVar7 = lVar7 + 1;
                            } while (bStack_e8.m_size != lVar7);
                          }
                        }
                        if ((bStack_e8.m_data != (btDbvtNode **)0x0) &&
                           (bStack_e8.m_ownsMemory == true)) {
                          btAlignedFreeInternal(bStack_e8.m_data);
                        }
                        bStack_e8.m_ownsMemory = true;
                        bStack_e8.m_data = local_c8;
                        bStack_e8.m_capacity = (int)local_b0;
                        lVar7 = local_b0;
                      }
                      do {
                        bStack_e8.m_data[lVar11] = (btDbvtNode *)0x0;
                        lVar11 = lVar11 + 1;
                      } while ((int)lVar7 != lVar11);
                    }
                    bStack_e8.m_size = (int)lVar7;
                    iVar8 = bStack_e8.m_size + -2;
                  }
                  bStack_e8.m_data[(long)iVar9 + -1] = (pbVar1->field_2).childs[0];
                  bStack_e8.m_data[iVar9] = (pbVar1->field_2).childs[1];
                  iVar10 = iVar9 + 1;
                }
              }
            }
          }
        }
      }
      iVar9 = iVar10;
    } while (iVar9 != 0);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&bStack_e8);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTest(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root)
		{
			btVector3 rayDir = (rayTo-rayFrom);
			rayDir.normalize ();

			///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
			btVector3 rayDirectionInverse;
			rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
			rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
			rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
			unsigned int signs[3] = { rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

			btScalar lambda_max = rayDir.dot(rayTo-rayFrom);

			btVector3 resultNormal;

			btAlignedObjectArray<const btDbvtNode*>	stack;

			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-2;

			stack.resize(DOUBLE_STACKSIZE);
			stack[0]=root;
			btVector3 bounds[2];
			do	{
				const btDbvtNode*	node=stack[--depth];

				bounds[0] = node->volume.Mins();
				bounds[1] = node->volume.Maxs();
				
				btScalar tmin=1.f,lambda_min=0.f;
				unsigned int result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);

#ifdef COMPARE_BTRAY_AABB2
				btScalar param=1.f;
				bool result2 = btRayAabb(rayFrom,rayTo,node->volume.Mins(),node->volume.Maxs(),param,resultNormal);
				btAssert(result1 == result2);
#endif //TEST_BTRAY_AABB2

				if(result1)
				{
					if(node->isinternal())
					{
						if(depth>treshold)
						{
							stack.resize(stack.size()*2);
							treshold=stack.size()-2;
						}
						stack[depth++]=node->childs[0];
						stack[depth++]=node->childs[1];
					}
					else
					{
						policy.Process(node);
					}
				}
			} while(depth);

		}
}